

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::make_l1_norm(quadratic_cost_type<double> *this,int n)

{
  double *pdVar1;
  quad *pqVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  pdVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  dVar6 = 0.0;
  uVar3 = 0;
  while ((uint)n != uVar3) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pdVar1[uVar3];
    uVar3 = uVar3 + 1;
    auVar9 = vandpd_avx(auVar8,auVar7);
    dVar6 = dVar6 + auVar9._0_8_;
  }
  lVar5 = 0;
  lVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n] << 4;
  while (lVar4 != lVar5) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)((long)&((this->quadratic_elements)._M_t.
                                      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                                     ._M_head_impl)->factor + lVar5);
    lVar5 = lVar5 + 0x10;
    auVar9 = vandpd_avx(auVar9,auVar7);
    dVar6 = dVar6 + auVar9._0_8_;
  }
  if ((uint)((long)ABS(dVar6) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      pdVar1[uVar3] = pdVar1[uVar3] / dVar6;
    }
    pqVar2 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
             _M_head_impl;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 0x10) {
      *(double *)((long)&pqVar2->factor + lVar5) =
           *(double *)((long)&pqVar2->factor + lVar5) / dVar6;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }